

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void store_pc_exc_ret(DisasContext_conflict1 *s,TCGv_i32 pc)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 pc_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_R[0xf],pc);
  tcg_temp_free_i32(tcg_ctx_00,pc);
  return;
}

Assistant:

static void store_pc_exc_ret(DisasContext *s, TCGv_i32 pc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_R[15], pc);
    tcg_temp_free_i32(tcg_ctx, pc);
}